

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkPrepareTwoNtks
              (FILE *pErr,Abc_Ntk_t *pNtk,char **argv,int argc,Abc_Ntk_t **ppNtk1,Abc_Ntk_t **ppNtk2
              ,int *pfDelete1,int *pfDelete2)

{
  Io_FileType_t IVar1;
  FILE *__stream;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  size_t __size;
  char *pcVar5;
  
  *pfDelete1 = 0;
  *pfDelete2 = 0;
  if (argc == 2) {
    pcVar5 = *argv;
    IVar1 = Io_ReadFileType(pcVar5);
    pAVar2 = Io_Read(pcVar5,IVar1,1,0);
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      return 0;
    }
    pcVar5 = argv[1];
    IVar1 = Io_ReadFileType(pcVar5);
    pNtk_00 = Io_Read(pcVar5,IVar1,1,0);
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_NtkDelete(pAVar2);
      return 0;
    }
LAB_001f2879:
    *pfDelete1 = 1;
    *pfDelete2 = 1;
    pAVar3 = pAVar2;
    if (pAVar2->ntkType != ABC_NTK_STRASH) {
      pAVar3 = Abc_NtkStrash(pAVar2,0,1,0);
      if (*pfDelete1 != 0) {
        Abc_NtkDelete(pAVar2);
      }
      *pfDelete1 = 1;
    }
    pAVar2 = pNtk_00;
    if (pNtk_00->ntkType != ABC_NTK_STRASH) {
      pAVar2 = Abc_NtkStrash(pNtk_00,0,1,0);
      if (*pfDelete2 != 0) {
        Abc_NtkDelete(pNtk_00);
      }
      *pfDelete2 = 1;
    }
    *ppNtk1 = pAVar3;
    *ppNtk2 = pAVar2;
    iVar4 = 1;
  }
  else {
    if (argc == 1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        pAVar2 = Abc_NtkDup(pNtk);
        pcVar5 = *argv;
LAB_001f27f9:
        IVar1 = Io_ReadFileType(pcVar5);
        pNtk_00 = Io_Read(pcVar5,IVar1,1,0);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          return 0;
        }
        goto LAB_001f2879;
      }
LAB_001f290e:
      pcVar5 = "Empty current network.\n";
      __size = 0x17;
    }
    else if (argc == 0) {
      if (pNtk == (Abc_Ntk_t *)0x0) goto LAB_001f290e;
      if (pNtk->pSpec != (char *)0x0) {
        __stream = fopen(pNtk->pSpec,"r");
        if (__stream == (FILE *)0x0) {
          fprintf((FILE *)pErr,"Cannot open the external spec file \"%s\".\n",pNtk->pSpec);
          return 0;
        }
        fclose(__stream);
        pAVar2 = Abc_NtkDup(pNtk);
        pcVar5 = pNtk->pSpec;
        goto LAB_001f27f9;
      }
      pcVar5 = "The external spec is not given.\n";
      __size = 0x20;
    }
    else {
      pcVar5 = "Wrong number of arguments.\n";
      __size = 0x1b;
    }
    fwrite(pcVar5,__size,1,(FILE *)pErr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Abc_NtkPrepareTwoNtks( FILE * pErr, Abc_Ntk_t * pNtk, char ** argv, int argc, 
    Abc_Ntk_t ** ppNtk1, Abc_Ntk_t ** ppNtk2, int * pfDelete1, int * pfDelete2 )
{
    int fCheck = 1;
    FILE * pFile;
    Abc_Ntk_t * pNtk1, * pNtk2, * pNtkTemp;
    int util_optind = 0;

    *pfDelete1 = 0;
    *pfDelete2 = 0;
    if ( argc == util_optind ) 
    { // use the spec
        if ( pNtk == NULL )
        {
            fprintf( pErr, "Empty current network.\n" );
            return 0;
        }
        if ( pNtk->pSpec == NULL )
        {
            fprintf( pErr, "The external spec is not given.\n" );
            return 0;
        }
        pFile = fopen( pNtk->pSpec, "r" );
        if ( pFile == NULL )
        {
            fprintf( pErr, "Cannot open the external spec file \"%s\".\n", pNtk->pSpec );
            return 0;
        }
        else
            fclose( pFile );
        pNtk1 = Abc_NtkDup(pNtk);
        pNtk2 = Io_Read( pNtk->pSpec, Io_ReadFileType(pNtk->pSpec), fCheck, 0 );
        if ( pNtk2 == NULL )
            return 0;
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else if ( argc == util_optind + 1 ) 
    {
        if ( pNtk == NULL )
        {
            fprintf( pErr, "Empty current network.\n" );
            return 0;
        }
        pNtk1 = Abc_NtkDup(pNtk);
        pNtk2 = Io_Read( argv[util_optind], Io_ReadFileType(argv[util_optind]), fCheck, 0 );
        if ( pNtk2 == NULL )
            return 0;
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else if ( argc == util_optind + 2 ) 
    {
        pNtk1 = Io_Read( argv[util_optind], Io_ReadFileType(argv[util_optind]), fCheck, 0 );
        if ( pNtk1 == NULL )
            return 0;
        pNtk2 = Io_Read( argv[util_optind+1], Io_ReadFileType(argv[util_optind+1]), fCheck, 0 );
        if ( pNtk2 == NULL )
        {
            Abc_NtkDelete( pNtk1 );
            return 0;
        }
        *pfDelete1 = 1;
        *pfDelete2 = 1;
    }
    else
    {
        fprintf( pErr, "Wrong number of arguments.\n" );
        return 0;
    }

    // make sure the networks are strashed
    if ( !Abc_NtkIsStrash(pNtk1) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk1, 0, 1, 0 );
        if ( *pfDelete1 )
            Abc_NtkDelete( pNtk1 );
        pNtk1 = pNtkTemp;
        *pfDelete1 = 1;
    }
    if ( !Abc_NtkIsStrash(pNtk2) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk2, 0, 1, 0 );
        if ( *pfDelete2 )
            Abc_NtkDelete( pNtk2 );
        pNtk2 = pNtkTemp;
        *pfDelete2 = 1;
    }

    *ppNtk1 = pNtk1;
    *ppNtk2 = pNtk2;
    return 1;
}